

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int solveTasks(char *filename)

{
  int iVar1;
  HModel model;
  HDual solver;
  
  HModel::HModel(&model);
  _model = 1;
  iVar1 = HModel::load_fromMPS((char *)&model);
  if (iVar1 == 0) {
    HModel::scaleModel();
    HDual::HDual(&solver);
    HDual::solve((HModel *)&solver,(int)&model,1);
    HModel::util_reportSolverOutcome((char *)&model);
    HModel::writePivots((char *)&model);
    HDual::~HDual(&solver);
  }
  HModel::~HModel(&model);
  return iVar1;
}

Assistant:

int solveTasks(const char *filename) {
    HModel model;
    model.intOption[INTOPT_PRINT_FLAG] = 1;
    model.intOption[INTOPT_PERMUTE_FLAG] = 1;
    int RtCd = model.load_fromMPS(filename);
    if (RtCd) return RtCd;

    model.scaleModel();
    HDual solver;
    solver.solve(&model, HDUAL_VARIANT_TASKS, 8);

    model.util_reportSolverOutcome("Solve tasks");
#ifdef JAJH_dev
    model.writePivots("tasks");
#endif
    return 0;
}